

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetPropertyInternal(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  byte bVar1;
  JSShape *pJVar2;
  JSClassExoticMethods *pJVar3;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *p_Var4;
  _func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *p_Var5;
  JSValue getter;
  JSValue getter_00;
  JSValue setter;
  JSValue setter_00;
  int iVar6;
  int iVar7;
  JSValueUnion *pJVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  JSValueUnion JVar12;
  JSValueUnion JVar13;
  JSObject **prs;
  void *pvVar14;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar15;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar16;
  JSValue JVar17;
  JSValue this_obj_local;
  JSValueUnion local_b0;
  JSPropertyDescriptor desc;
  uint uStack_6c;
  uint uStack_5c;
  uint uStack_4c;
  uint uStack_3c;
  
  pvVar14 = (void *)val.tag;
  JVar13 = val.u;
  JVar16.tag = (JSValueUnion)this_obj.tag;
  JVar12 = this_obj.u;
  iVar6 = (int)this_obj.tag;
  if (iVar6 != -1) {
    if (iVar6 == 3) {
      JS_FreeValue(ctx,val);
      pcVar11 = "cannot set property \'%s\' of undefined";
    }
    else {
      if (iVar6 != 2) {
        JVar16.u.ptr = (void *)JVar16.tag;
        JVar16 = JS_GetPrototypePrimitive(ctx,JVar16);
        JVar12 = JVar16.u;
        local_b0.float64 = 0.0;
        goto LAB_0011a2cc;
      }
      JS_FreeValue(ctx,val);
      pcVar11 = "cannot set property \'%s\' of null";
    }
    __JS_ThrowTypeErrorAtom(ctx,prop,pcVar11);
    return -1;
  }
  pJVar2 = *(JSShape **)((long)JVar12.ptr + 0x18);
  uVar9 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
  while (local_b0 = JVar12, uVar9 != 0) {
    uVar10 = (ulong)uVar9;
    if (*(JSAtom *)((long)&pJVar2->proto + uVar10 * 8 + 4) == prop) {
      uVar9 = *(uint *)(&pJVar2->proto + uVar10);
      if ((uVar9 & 0xe8000000) == 0x8000000) {
        set_value(ctx,(JSValue *)(*(JSProperty **)((long)JVar12.ptr + 0x20) + (uVar10 - 1)),val);
        return 1;
      }
      if ((uVar9 >> 0x1d & 1) != 0) {
        iVar6 = set_array_length(ctx,(JSObject *)JVar12.ptr,val,flags);
        return iVar6;
      }
      iVar6 = (*(code *)(&DAT_0017d5d4 + *(int *)(&DAT_0017d5d4 + (ulong)(uVar9 >> 0x1e) * 4)))();
      return iVar6;
    }
    uVar9 = *(uint *)(&pJVar2->proto + uVar10) & 0x3ffffff;
  }
LAB_0011a0f7:
  do {
    iVar6 = -1;
    if ((*(byte *)((long)JVar12.ptr + 5) & 4) != 0) {
      if ((*(byte *)((long)JVar12.ptr + 5) & 8) != 0) {
        if (-1 < (int)prop) {
          if ((ushort)(*(short *)((long)JVar12.ptr + 6) - 0x15U) < 9) {
            iVar7 = JS_AtomIsNumericIndex(ctx,prop);
            if (iVar7 != 0) {
              if (iVar7 < 0) goto LAB_0011a49e;
              goto LAB_0011a55a;
            }
          }
          goto LAB_0011a2c3;
        }
        if (*(uint *)((long)JVar12.ptr + 0x40) <= (prop & 0x7fffffff)) {
          if ((ushort)(*(short *)((long)JVar12.ptr + 6) - 0x15U) < 9) {
LAB_0011a55a:
            JVar16 = JS_ToNumberFree(ctx,val);
            JS_FreeValue(ctx,JVar16);
            if ((int)JVar16.tag == 6) {
              return -1;
            }
            pcVar11 = "out-of-bound numeric index";
            goto LAB_0011a589;
          }
          goto LAB_0011a2c3;
        }
        if (local_b0.ptr == JVar12.ptr) {
          iVar6 = JS_SetPropertyValue(ctx,this_obj,(JSValue)ZEXT416(prop & 0x7fffffff),val,flags);
          return iVar6;
        }
LAB_0011a3b3:
        iVar6 = -1;
        if (((uint)flags >> 0x10 & 1) != 0) {
          JS_FreeValue(ctx,val);
          JS_ThrowReferenceErrorNotDefined(ctx,prop);
          return -1;
        }
        if ((JSObject *)local_b0.ptr == (JSObject *)0x0) {
          JS_FreeValue(ctx,val);
          pcVar11 = "not an object";
        }
        else {
          bVar1 = *(byte *)((long)local_b0.ptr + 5);
          if ((bVar1 & 1) != 0) {
            if ((bVar1 & 4) == 0) {
              pJVar8 = (JSValueUnion *)add_property(ctx,(JSObject *)local_b0.ptr,prop,7);
              if (pJVar8 != (JSValueUnion *)0x0) {
                pJVar8->ptr = (void *)JVar13;
                pJVar8[1].ptr = pvVar14;
                return 1;
              }
            }
            else {
              if (((((int)prop < 0) && ((bVar1 & 8) != 0)) &&
                  (*(short *)((long)local_b0.ptr + 6) == 2)) &&
                 ((prop & 0x7fffffff) == *(uint *)((long)local_b0.ptr + 0x40))) {
                iVar6 = add_fast_array_element(ctx,(JSObject *)local_b0.ptr,val,flags);
                return iVar6;
              }
              getter_00.tag = 3;
              getter_00.u.ptr = (void *)((ulong)uStack_5c << 0x20);
              setter_00.tag = 3;
              setter_00.u.ptr = (void *)((ulong)uStack_6c << 0x20);
              iVar6 = JS_CreateProperty(ctx,(JSObject *)local_b0.ptr,prop,val,getter_00,setter_00,
                                        flags | 0x2707);
            }
LAB_0011a49e:
            JS_FreeValue(ctx,val);
            return iVar6;
          }
          JS_FreeValue(ctx,val);
          pcVar11 = "object is not extensible";
        }
LAB_0011a589:
        iVar6 = JS_ThrowTypeErrorOrFalse(ctx,flags,pcVar11);
        return iVar6;
      }
      pJVar3 = ctx->rt->class_array[*(ushort *)((long)JVar12.ptr + 6)].exotic;
      if (pJVar3 == (JSClassExoticMethods *)0x0) goto LAB_0011a2c3;
      p_Var4 = pJVar3->set_property;
      if (p_Var4 != (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *)0x0) {
        *(int *)JVar12.ptr = *JVar12.ptr + 1;
        JVar15.tag = -1;
        JVar15.u.ptr = JVar12.ptr;
        iVar6 = (*p_Var4)(ctx,JVar15,prop,val,this_obj,flags);
        v_00.tag = -1;
        v_00.u.ptr = JVar12.ptr;
        JS_FreeValue(ctx,v_00);
        JS_FreeValue(ctx,val);
        return iVar6;
      }
      p_Var5 = pJVar3->get_own_property;
      if (p_Var5 != (_func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *)0x0) {
        *(int *)JVar12.ptr = *JVar12.ptr + 1;
        JVar17.tag = -1;
        JVar17.u.ptr = JVar12.ptr;
        iVar6 = (*p_Var5)(ctx,&desc,JVar17,prop);
        v.tag = -1;
        v.u.ptr = JVar12.ptr;
        JS_FreeValue(ctx,v);
        if (iVar6 < 0) {
LAB_0011a5fd:
          v_01.tag = (int64_t)pvVar14;
          v_01.u.float64 = JVar13.float64;
          JS_FreeValue(ctx,v_01);
          return iVar6;
        }
        if (iVar6 != 0) {
          if (((byte)desc.flags & 0x10) != 0) {
            JVar12 = desc.setter.u;
            if ((int)desc.setter.tag == 3) {
              JVar12.float64 = 0.0;
            }
            iVar6 = call_setter(ctx,(JSObject *)JVar12.ptr,this_obj,val,flags);
            JS_FreeValue(ctx,desc.getter);
            pvVar14 = (void *)CONCAT44(desc.setter.tag._4_4_,(int)desc.setter.tag);
            JVar13 = desc.setter.u;
            goto LAB_0011a5fd;
          }
          JS_FreeValue(ctx,desc.value);
          if (((byte)desc.flags & 2) != 0) {
            if (local_b0.ptr == JVar12.ptr) {
              getter.tag = 3;
              getter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
              setter.tag = 3;
              setter.u.ptr = (void *)((ulong)uStack_4c << 0x20);
              iVar6 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,0x2000);
              goto LAB_0011a49e;
            }
            goto LAB_0011a3b3;
          }
          break;
        }
      }
    }
LAB_0011a2c3:
    JVar12 = (JSValueUnion)(*(JSShape **)((long)JVar12.ptr + 0x18))->proto;
LAB_0011a2cc:
    if ((JSObject *)JVar12.ptr == (JSObject *)0x0) goto LAB_0011a3b3;
    while( true ) {
      pJVar2 = *(JSShape **)((long)JVar12.ptr + 0x18);
      uVar9 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      while( true ) {
        if (uVar9 == 0) goto LAB_0011a0f7;
        uVar10 = (ulong)uVar9;
        prs = &pJVar2->proto + uVar10;
        if (*(JSAtom *)((long)&pJVar2->proto + uVar10 * 8 + 4) == prop) break;
        uVar9 = *(uint *)prs & 0x3ffffff;
      }
      uVar9 = *(uint *)prs >> 0x1a & 0xfffffff0;
      if (uVar9 != 0x30) break;
      iVar6 = JS_AutoInitProperty(ctx,(JSObject *)JVar12.ptr,prop,
                                  *(JSProperty **)((long)JVar12.ptr + 0x20) + (uVar10 - 1),
                                  (JSShapeProperty *)prs);
      if (iVar6 != 0) {
        return -1;
      }
    }
    if (uVar9 == 0x10) {
      iVar6 = call_setter(ctx,(*(JSProperty **)((long)JVar12.ptr + 0x20))[uVar10 - 1].u.getset.
                              setter,this_obj,val,flags);
      return iVar6;
    }
  } while ((*(uint *)prs >> 0x1b & 1) != 0);
  JS_FreeValue(ctx,val);
  iVar6 = JS_ThrowTypeErrorReadOnly(ctx,flags,prop);
  return iVar6;
}

Assistant:

int JS_SetPropertyInternal(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    JSObject *p, *p1;
    JSShapeProperty *prs;
    JSProperty *pr;
    uint32_t tag;
    JSPropertyDescriptor desc;
    int ret;
#if 0
    printf("JS_SetPropertyInternal: "); print_atom(ctx, prop); printf("\n");
#endif
    tag = JS_VALUE_GET_TAG(this_obj);
    if (unlikely(tag != JS_TAG_OBJECT)) {
        switch(tag) {
        case JS_TAG_NULL:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of null", prop);
            return -1;
        case JS_TAG_UNDEFINED:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of undefined", prop);
            return -1;
        default:
            /* even on a primitive type we can have setters on the prototype */
            p = NULL;
            p1 = JS_VALUE_GET_OBJ(JS_GetPrototypePrimitive(ctx, this_obj));
            goto prototype_lookup;
        }
    }
    p = JS_VALUE_GET_OBJ(this_obj);
retry:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        if (likely((prs->flags & (JS_PROP_TMASK | JS_PROP_WRITABLE |
                                  JS_PROP_LENGTH)) == JS_PROP_WRITABLE)) {
            /* fast case */
            set_value(ctx, &pr->u.value, val);
            return TRUE;
        } else if (prs->flags & JS_PROP_LENGTH) {
            assert(p->class_id == JS_CLASS_ARRAY);
            assert(prop == JS_ATOM_length);
            return set_array_length(ctx, p, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
            return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
            /* JS_PROP_WRITABLE is always true for variable
               references, but they are write protected in module name
               spaces. */
            if (p->class_id == JS_CLASS_MODULE_NS)
                goto read_only_prop;
            set_value(ctx, pr->u.var_ref->pvalue, val);
            return TRUE;
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry (potentially useless) */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs)) {
                JS_FreeValue(ctx, val);
                return -1;
            }
            goto retry;
        } else {
            goto read_only_prop;
        }
    }

    p1 = p;
    for(;;) {
        if (p1->is_exotic) {
            if (p1->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    uint32_t idx = __JS_AtomToUInt32(prop);
                    if (idx < p1->u.array.count) {
                        if (unlikely(p == p1))
                            return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val, flags);
                        else
                            break;
                    } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                               p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                        goto typed_array_oob;
                    }
                } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                           p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_AtomIsNumericIndex(ctx, prop);
                    if (ret != 0) {
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return -1;
                        }
                    typed_array_oob:
                        val = JS_ToNumberFree(ctx, val);
                        JS_FreeValue(ctx, val);
                        if (JS_IsException(val))
                            return -1;
                        return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
                    }
                }
            } else {
                const JSClassExoticMethods *em = ctx->rt->class_array[p1->class_id].exotic;
                if (em) {
                    JSValue obj1;
                    if (em->set_property) {
                        /* set_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->set_property(ctx, obj1, prop,
                                               val, this_obj, flags);
                        JS_FreeValue(ctx, obj1);
                        JS_FreeValue(ctx, val);
                        return ret;
                    }
                    if (em->get_own_property) {
                        /* get_own_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->get_own_property(ctx, &desc,
                                                   obj1, prop);
                        JS_FreeValue(ctx, obj1);
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return ret;
                        }
                        if (ret) {
                            if (desc.flags & JS_PROP_GETSET) {
                                JSObject *setter;
                                if (JS_IsUndefined(desc.setter))
                                    setter = NULL;
                                else
                                    setter = JS_VALUE_GET_OBJ(desc.setter);
                                ret = call_setter(ctx, setter, this_obj, val, flags);
                                JS_FreeValue(ctx, desc.getter);
                                JS_FreeValue(ctx, desc.setter);
                                return ret;
                            } else {
                                JS_FreeValue(ctx, desc.value);
                                if (!(desc.flags & JS_PROP_WRITABLE))
                                    goto read_only_prop;
                                if (likely(p == p1)) {
                                    ret = JS_DefineProperty(ctx, this_obj, prop, val,
                                                            JS_UNDEFINED, JS_UNDEFINED,
                                                            JS_PROP_HAS_VALUE);
                                    JS_FreeValue(ctx, val);
                                    return ret;
                                } else {
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
        p1 = p1->shape->proto;
    prototype_lookup:
        if (!p1)
            break;

    retry2:
        prs = find_own_property(&pr, p1, prop);
        if (prs) {
            if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
            } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
                /* Instantiate property and retry (potentially useless) */
                if (JS_AutoInitProperty(ctx, p1, prop, pr, prs))
                    return -1;
                goto retry2;
            } else if (!(prs->flags & JS_PROP_WRITABLE)) {
            read_only_prop:
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, prop);
            }
        }
    }

    if (unlikely(flags & JS_PROP_NO_ADD)) {
        JS_FreeValue(ctx, val);
        JS_ThrowReferenceErrorNotDefined(ctx, prop);
        return -1;
    }

    if (unlikely(!p)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "not an object");
    }

    if (unlikely(!p->extensible)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array &&
            __JS_AtomIsTaggedInt(prop)) {
            uint32_t idx = __JS_AtomToUInt32(prop);
            if (idx == p->u.array.count) {
                /* fast case */
                return add_fast_array_element(ctx, p, val, flags);
            } else {
                goto generic_create_prop;
            }
        } else {
        generic_create_prop:
            ret = JS_CreateProperty(ctx, p, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                                    flags |
                                    JS_PROP_HAS_VALUE |
                                    JS_PROP_HAS_ENUMERABLE |
                                    JS_PROP_HAS_WRITABLE |
                                    JS_PROP_HAS_CONFIGURABLE |
                                    JS_PROP_C_W_E);
            JS_FreeValue(ctx, val);
            return ret;
        }
    }

    pr = add_property(ctx, p, prop, JS_PROP_C_W_E);
    if (unlikely(!pr)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    pr->u.value = val;
    return TRUE;
}